

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
::remove_values(btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                *this,field_type i,field_type to_erase,allocator_type *alloc)

{
  btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  bVar1;
  btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *pbVar2;
  byte bVar3;
  field_type fVar4;
  field_type fVar5;
  
  if (((ulong)this & 7) == 0) {
    bVar1 = this[10];
    bVar3 = to_erase + i;
    transfer_n(this,(long)(int)((uint)(byte)bVar1 - (uint)bVar3),(ulong)i,(ulong)(uint)bVar3,this,
               alloc);
    if (this[0xb] ==
        (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
         )0x0) {
      if (to_erase != '\0') {
        fVar4 = i + '\x01';
        fVar5 = to_erase;
        do {
          pbVar2 = child(this,fVar4);
          clear_and_delete(pbVar2,alloc);
          fVar4 = fVar4 + '\x01';
          fVar5 = fVar5 + 0xff;
        } while (fVar5 != '\0');
      }
      if ((byte)(bVar3 + 1) <= (byte)bVar1) {
        fVar4 = i + '\x01';
        do {
          pbVar2 = child(this,to_erase + fVar4);
          set_child(this,fVar4,pbVar2);
          mutable_child(this,to_erase + fVar4);
          fVar4 = fVar4 + '\x01';
        } while ((byte)(to_erase + fVar4) <= (byte)bVar1);
      }
    }
    this[10] = (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                )((char)bVar1 - to_erase);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, google::protobuf::internal::ExtensionSet::Extension>, absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 7, 8>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, google::protobuf::internal::ExtensionSet::Extension>, absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 7, 8>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 3UL, Char = char]"
               );
}

Assistant:

inline void btree_node<P>::remove_values(const field_type i,
                                         const field_type to_erase,
                                         allocator_type *alloc) {
  // Transfer values after the removed range into their new places.
  value_destroy_n(i, to_erase, alloc);
  const field_type orig_finish = finish();
  const field_type src_i = i + to_erase;
  transfer_n(orig_finish - src_i, i, src_i, this, alloc);

  if (is_internal()) {
    // Delete all children between begin and end.
    for (field_type j = 0; j < to_erase; ++j) {
      clear_and_delete(child(i + j + 1), alloc);
    }
    // Rotate children after end into new positions.
    for (field_type j = i + to_erase + 1; j <= orig_finish; ++j) {
      set_child(j - to_erase, child(j));
      clear_child(j);
    }
  }
  set_finish(orig_finish - to_erase);
}